

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

double * Eigen::internal::conditional_aligned_new_auto<double,true>(size_t size)

{
  double *pdVar1;
  
  if (size != 0) {
    if (size >> 0x3d != 0) {
      throw_std_bad_alloc();
    }
    pdVar1 = (double *)aligned_malloc(size << 3);
    return pdVar1;
  }
  return (double *)0x0;
}

Assistant:

EIGEN_DEVICE_FUNC inline T* conditional_aligned_new_auto(std::size_t size)
{
  if(size==0)
    return 0; // short-cut. Also fixes Bug 884
  check_size_for_overflow<T>(size);
  T *result = reinterpret_cast<T*>(conditional_aligned_malloc<Align>(sizeof(T)*size));
  if(NumTraits<T>::RequireInitialization)
  {
    EIGEN_TRY
    {
      construct_elements_of_array(result, size);
    }
    EIGEN_CATCH(...)
    {
      conditional_aligned_free<Align>(result);
      EIGEN_THROW;
    }
  }